

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

int __thiscall re2::DFA::BuildAllStates(DFA *this)

{
  pointer *this_00;
  State *pSVar1;
  bool bVar2;
  State *pSVar3;
  reference ppSVar4;
  size_type sVar5;
  pair<std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>,_bool> pVar6;
  bool local_191;
  _Node_iterator_base<re2::DFA::State_*,_true> local_148;
  _Node_iterator_base<re2::DFA::State_*,_true> local_140;
  State *local_138;
  State *ns;
  value_type pSStack_128;
  int c;
  State *s;
  size_t i;
  undefined1 local_110;
  undefined1 local_108 [8];
  vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> q;
  StateSet queued;
  StringPiece local_b0 [2];
  StringPiece local_90;
  undefined1 local_80 [8];
  SearchParams params;
  RWLocker l;
  DFA *this_local;
  
  bVar2 = ok(this);
  if (bVar2) {
    RWLocker::RWLocker((RWLocker *)&params.matches,&this->cache_mutex_);
    StringPiece::StringPiece(&local_90,(char *)0x0);
    StringPiece::StringPiece(local_b0,(char *)0x0);
    SearchParams::SearchParams
              ((SearchParams *)local_80,&local_90,local_b0,(RWLocker *)&params.matches);
    params.context.length_._0_1_ = 0;
    bVar2 = AnalyzeSearch(this,(SearchParams *)local_80);
    if ((bVar2) && (2 < (ulong)params._32_8_)) {
      this_00 = &q.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      std::
      unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
      ::unordered_set((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                       *)this_00);
      std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::vector
                ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_108);
      pVar6 = std::
              unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
              ::insert((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                        *)this_00,(value_type *)&params.anchored);
      i = (size_t)pVar6.first.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur;
      local_110 = pVar6.second;
      std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
                ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_108,
                 (value_type *)&params.anchored);
      for (s = (State *)0x0; pSVar1 = s,
          pSVar3 = (State *)std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::size
                                      ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                                        *)local_108), pSVar1 < pSVar3;
          s = (State *)((long)&s->inst_ + 1)) {
        ppSVar4 = std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::operator[]
                            ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)
                             local_108,(size_type)s);
        pSStack_128 = *ppSVar4;
        for (ns._4_4_ = 0; ns._4_4_ < 0x101; ns._4_4_ = ns._4_4_ + 1) {
          local_138 = RunStateOnByteUnlocked(this,pSStack_128,ns._4_4_);
          local_191 = false;
          if ((State *)0x2 < local_138) {
            local_140._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                 ::find((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                         *)&q.
                            super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
            local_148._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                 ::end((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                        *)&q.
                           super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_191 = std::__detail::operator==(&local_140,&local_148);
          }
          if (local_191 != false) {
            std::
            unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
            ::insert((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                      *)&q.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
            std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
                      ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_108,
                       &local_138);
          }
        }
      }
      sVar5 = std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::size
                        ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_108)
      ;
      this_local._4_4_ = (int)sVar5;
      std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::~vector
                ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_108);
      std::
      unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
      ::~unordered_set((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                        *)&q.
                           super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      this_local._4_4_ = 0;
    }
    RWLocker::~RWLocker((RWLocker *)&params.matches);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int DFA::BuildAllStates() {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) || params.start <= SpecialStateMax)
    return 0;

  // Add start state to work queue.
  StateSet queued;
  vector<State*> q;
  queued.insert(params.start);
  q.push_back(params.start);

  // Flood to expand every state.
  for (size_t i = 0; i < q.size(); i++) {
    State* s = q[i];
    for (int c = 0; c < 257; c++) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns > SpecialStateMax && queued.find(ns) == queued.end()) {
        queued.insert(ns);
        q.push_back(ns);
      }
    }
  }

  return static_cast<int>(q.size());
}